

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

void deqp::egl::drawRectangle(Functions *gl,IVec2 *pos,IVec2 *size,Vec3 *color)

{
  GLenum err;
  
  (*gl->clearColor)(color->m_data[0],color->m_data[1],color->m_data[2],1.0);
  (*gl->scissor)(pos->m_data[0],pos->m_data[1],size->m_data[0],size->m_data[1]);
  (*gl->enable)(0xc11);
  (*gl->clear)(0x4000);
  (*gl->disable)(0xc11);
  err = (*gl->getError)();
  glu::checkError(err,"Rectangle drawing with glScissor and glClear failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,0xeb);
  return;
}

Assistant:

void drawRectangle (const glw::Functions& gl, IVec2 pos, IVec2 size, Vec3 color)
{
	gl.clearColor(color.x(), color.y(), color.z(), 1.0);
	gl.scissor(pos.x(), pos.y(), size.x(), size.y());
	gl.enable(GL_SCISSOR_TEST);
	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.disable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"Rectangle drawing with glScissor and glClear failed.");
}